

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseEditStart(linenoiseState *l,int stdin_fd,int stdout_fd,char *buf,size_t buflen,
                      char *prompt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  int iVar5;
  
  iVar5 = 0;
  if (stdin_fd == -1) {
    stdin_fd = 0;
  }
  iVar2 = 1;
  if (stdout_fd != -1) {
    iVar2 = stdout_fd;
  }
  l->in_completion = 0;
  l->ifd = stdin_fd;
  l->ofd = iVar2;
  l->buf = buf;
  l->buflen = buflen;
  l->prompt = prompt;
  sVar3 = strlen(prompt);
  l->plen = sVar3;
  l->pos = 0;
  l->oldcolpos = 0;
  l->oldcollen = 0;
  l->len = 0;
  iVar1 = enableRawMode(stdin_fd);
  if (iVar1 == -1) {
    iVar5 = -1;
  }
  else {
    iVar2 = getColumns(stdin_fd,iVar2);
    l->cols = (long)iVar2;
    l->oldrows = 0;
    l->history_index = 0;
    l->prev_history_index = 0;
    *l->buf = '\0';
    l->buflen = l->buflen - 1;
    iVar2 = isatty(l->ifd);
    if (iVar2 != 0) {
      linenoiseHistoryAdd("");
      sVar4 = write(l->ofd,prompt,l->plen);
      iVar5 = -(uint)(sVar4 == -1);
    }
  }
  return iVar5;
}

Assistant:

int linenoiseEditStart(struct linenoiseState *l, int stdin_fd, int stdout_fd, char *buf, size_t buflen, const char *prompt) {
    if (stdin_fd == -1) stdin_fd = STDIN_FILENO;
    if (stdout_fd == -1) stdout_fd = STDOUT_FILENO;

    /* Populate the linenoise state that we pass to functions implementing
     * specific editing functionalities. */
    l->in_completion = 0;
    l->ifd = stdin_fd;
    l->ofd = stdout_fd;
    l->buf = buf;
    l->buflen = buflen;
    l->prompt = prompt;
    l->plen = strlen(prompt);
    l->oldcolpos = l->pos = 0;
    l->oldcollen = 0;
    l->len = 0;

    /* Enter raw mode. */
    if (enableRawMode(l->ifd) == -1) return -1;

    l->cols = getColumns(stdin_fd, stdout_fd);
    l->oldrows = 0;
    l->history_index = 0;
    l->prev_history_index = 0;

    /* Buffer starts empty. */
    l->buf[0] = '\0';
    l->buflen--; /* Make sure there is always space for the nulterm */

    /* If stdin is not a tty, stop here with the initialization. We
     * will actually just read a line from standard input in blocking
     * mode later, in linenoiseEditFeed(). */
    if (!isatty(l->ifd)) return 0;

    /* The latest history entry is always our current buffer, that
     * initially is just an empty string. */
    linenoiseHistoryAdd("");

    if (write(l->ofd,prompt,l->plen) == -1) return -1;
    return 0;
}